

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

_Bool ossl_data_pending(connectdata *conn,int connindex)

{
  SSL *pSVar1;
  int iVar2;
  
  pSVar1 = (SSL *)(conn->ssl[connindex].backend)->handle;
  if ((pSVar1 != (SSL *)0x0) && (iVar2 = SSL_pending(pSVar1), iVar2 != 0)) {
    return true;
  }
  pSVar1 = (SSL *)(conn->proxy_ssl[connindex].backend)->handle;
  if ((pSVar1 != (SSL *)0x0) && (iVar2 = SSL_pending(pSVar1), iVar2 != 0)) {
    return true;
  }
  return false;
}

Assistant:

static bool ossl_data_pending(const struct connectdata *conn,
                              int connindex)
{
  const struct ssl_connect_data *connssl = &conn->ssl[connindex];
  DEBUGASSERT(connssl->backend);
  if(connssl->backend->handle && SSL_pending(connssl->backend->handle))
    return TRUE;
#ifndef CURL_DISABLE_PROXY
  {
    const struct ssl_connect_data *proxyssl = &conn->proxy_ssl[connindex];
    DEBUGASSERT(proxyssl->backend);
    if(proxyssl->backend->handle && SSL_pending(proxyssl->backend->handle))
      return TRUE;
  }
#endif
  return FALSE;
}